

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFExporter::ExportMetadata(glTFExporter *this)

{
  aiMetadata *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  element_type *peVar5;
  char *pcVar6;
  allocator<char> local_541;
  string local_540;
  undefined1 local_51c [8];
  aiString copyright_str;
  char buffer [256];
  AssetMetadata *asset;
  glTFExporter *this_local;
  
  peVar5 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  std::__cxx11::string::operator=((string *)&(peVar5->asset).version,"1.0");
  uVar2 = aiGetVersionMajor();
  uVar3 = aiGetVersionMinor();
  uVar4 = aiGetVersionRevision();
  snprintf(copyright_str.data + 0x3f8,0x100,"Open Asset Import Library (assimp v%d.%d.%d)",
           (ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  std::__cxx11::string::operator=((string *)&(peVar5->asset).generator,copyright_str.data + 0x3f8);
  aiString::aiString((aiString *)local_51c);
  this_00 = this->mScene->mMetaData;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"SourceAsset_Copyright",&local_541);
  bVar1 = aiMetadata::Get<aiString>(this_00,&local_540,(aiString *)local_51c);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  if (bVar1) {
    pcVar6 = aiString::C_Str((aiString *)local_51c);
    std::__cxx11::string::operator=((string *)&peVar5->asset,pcVar6);
  }
  return;
}

Assistant:

void glTFExporter::ExportMetadata()
{
    glTF::AssetMetadata& asset = mAsset->asset;
    asset.version = "1.0";

    char buffer[256];
    ai_snprintf(buffer, 256, "Open Asset Import Library (assimp v%d.%d.%d)",
        aiGetVersionMajor(), aiGetVersionMinor(), aiGetVersionRevision());

    asset.generator = buffer;

	// Copyright
	aiString copyright_str;
	if (mScene->mMetaData->Get(AI_METADATA_SOURCE_COPYRIGHT, copyright_str)) {
		asset.copyright = copyright_str.C_Str();
	}
}